

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

DWORD GetCurrentDirectoryA(DWORD nBufferLength,LPSTR lpBuffer)

{
  char *__s;
  size_t sVar1;
  char *current_dir;
  DWORD dwLastError;
  DWORD dwDirLen;
  LPSTR lpBuffer_local;
  DWORD nBufferLength_local;
  
  current_dir._4_4_ = 0;
  current_dir._0_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  __s = PAL__getcwd((char *)0x0,0x401);
  if (__s == (char *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    current_dir._0_4_ = DIRGetLastErrorFromErrno();
  }
  else {
    sVar1 = strlen(__s);
    current_dir._4_4_ = (uint)sVar1;
    if (current_dir._4_4_ < nBufferLength) {
      strcpy_s(lpBuffer,(ulong)nBufferLength,__s);
    }
    else {
      current_dir._4_4_ = current_dir._4_4_ + 1;
    }
  }
  PAL_free(__s);
  if ((DWORD)current_dir != 0) {
    SetLastError((DWORD)current_dir);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return current_dir._4_4_;
}

Assistant:

DWORD
PALAPI
GetCurrentDirectoryA(
             IN DWORD nBufferLength,
             OUT LPSTR lpBuffer)
{
    DWORD dwDirLen = 0;
    DWORD dwLastError = 0;

    char  *current_dir;

    PERF_ENTRY(GetCurrentDirectoryA);
    ENTRY("GetCurrentDirectoryA(nBufferLength=%u, lpBuffer=%p)\n", nBufferLength, lpBuffer);

    /* NULL first arg means getcwd will allocate the string */
    current_dir = PAL__getcwd( NULL, MAX_LONGPATH + 1 );

    if ( !current_dir )
    {
        WARN( "PAL__getcwd returned NULL\n" );
        dwLastError = DIRGetLastErrorFromErrno();
        goto done;
    }

    dwDirLen = strlen( current_dir );

    /* if the supplied buffer isn't long enough, return the required
       length, including room for the NULL terminator */
    if ( nBufferLength <= dwDirLen )
    {
        ++dwDirLen; /* include space for the NULL */
        goto done;
    }
    else
    {
        strcpy_s( lpBuffer, nBufferLength, current_dir );
    }

done:
    PAL_free( current_dir );

    if ( dwLastError )
    {
        SetLastError(dwLastError);
    }

    LOGEXIT("GetCurrentDirectoryA returns DWORD %u\n", dwDirLen);
    PERF_EXIT(GetCurrentDirectoryA);
    return dwDirLen;
}